

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImParseFormatTrimDecorations(char *fmt,char *buf,int buf_size)

{
  int iVar1;
  char *fmt_00;
  char *pcVar2;
  
  fmt_00 = ImParseFormatFindStart(fmt);
  if ((*fmt_00 == '%') && (pcVar2 = ImParseFormatFindEnd(fmt_00), fmt = fmt_00, *pcVar2 != '\0')) {
    iVar1 = ((int)pcVar2 - (int)fmt_00) + 1;
    if (buf_size <= iVar1) {
      iVar1 = buf_size;
    }
    ImStrncpy(buf,fmt_00,(long)iVar1);
    fmt = buf;
  }
  return fmt;
}

Assistant:

const char* ImParseFormatTrimDecorations(const char* fmt, char* buf, int buf_size)
{
    const char* fmt_start = ImParseFormatFindStart(fmt);
    if (fmt_start[0] != '%')
        return fmt;
    const char* fmt_end = ImParseFormatFindEnd(fmt_start);
    if (fmt_end[0] == 0) // If we only have leading decoration, we don't need to copy the data.
        return fmt_start;
    ImStrncpy(buf, fmt_start, ImMin((int)(fmt_end + 1 - fmt_start), buf_size));
    return buf;
}